

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::_q_actionHovered(QMenuPrivate *this)

{
  QObject *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  long local_30;
  void *local_28;
  long *plStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::sender();
  lVar2 = QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (lVar2 != 0) {
    plStack_20 = &local_30;
    local_28 = (void *)0x0;
    local_30 = lVar2;
    QMetaObject::activate(pQVar1,&QMenu::staticMetaObject,3,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::_q_actionHovered()
{
    Q_Q(QMenu);
    if (QAction * action = qobject_cast<QAction *>(q->sender())) {
        emit q->hovered(action);
    }
}